

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ref_recon.c
# Opt level: O3

REF_STATUS ref_recon_abs_value_hessian(REF_GRID ref_grid,REF_DBL *hessian)

{
  REF_NODE ref_node;
  undefined1 auVar1 [16];
  int iVar2;
  uint uVar3;
  undefined8 uVar4;
  char *pcVar5;
  REF_DBL *m;
  long lVar6;
  undefined1 local_98 [16];
  double local_88;
  
  ref_node = ref_grid->node;
  iVar2 = ref_node->max;
  if (0 < iVar2) {
    lVar6 = 0;
    m = hessian;
    do {
      if ((-1 < ref_node->global[lVar6]) && (ref_node->ref_mpi->id == ref_node->part[lVar6])) {
        uVar3 = ref_matrix_diag_m(m,(REF_DBL *)local_98);
        if (uVar3 != 0) {
          pcVar5 = "decomp";
          uVar4 = 0x557;
          goto LAB_001dbc29;
        }
        auVar1._8_8_ = local_98._8_8_ ^ 0x8000000000000000;
        auVar1._0_8_ = local_98._0_8_ ^ 0x8000000000000000;
        local_98 = maxpd(local_98,auVar1);
        if (local_88 <= -local_88) {
          local_88 = -local_88;
        }
        uVar3 = ref_matrix_form_m((REF_DBL *)local_98,m);
        if (uVar3 != 0) {
          pcVar5 = "re-form";
          uVar4 = 0x55b;
          goto LAB_001dbc29;
        }
        iVar2 = ref_node->max;
      }
      lVar6 = lVar6 + 1;
      m = m + 6;
    } while (lVar6 < iVar2);
  }
  uVar3 = ref_node_ghost_dbl(ref_node,hessian,6);
  if (uVar3 == 0) {
    uVar3 = 0;
  }
  else {
    pcVar5 = "update ghosts";
    uVar4 = 0x55f;
LAB_001dbc29:
    printf("%s: %d: %s: %d %s\n",
           "/workspace/llm4binary/github/license_c_cmakelists/nasa[P]refine/src/ref_recon.c",uVar4,
           "ref_recon_abs_value_hessian",(ulong)uVar3,pcVar5);
  }
  return uVar3;
}

Assistant:

REF_FCN REF_STATUS ref_recon_abs_value_hessian(REF_GRID ref_grid,
                                               REF_DBL *hessian) {
  REF_NODE ref_node = ref_grid_node(ref_grid);
  REF_DBL diag_system[12];
  REF_INT node;

  /* positive eigenvalues to make positive definite */
  each_ref_node_valid_node(ref_node, node) {
    if (ref_node_owned(ref_node, node)) {
      RSS(ref_matrix_diag_m(&(hessian[6 * node]), diag_system), "decomp");
      ref_matrix_eig(diag_system, 0) = ABS(ref_matrix_eig(diag_system, 0));
      ref_matrix_eig(diag_system, 1) = ABS(ref_matrix_eig(diag_system, 1));
      ref_matrix_eig(diag_system, 2) = ABS(ref_matrix_eig(diag_system, 2));
      RSS(ref_matrix_form_m(diag_system, &(hessian[6 * node])), "re-form");
    }
  }

  RSS(ref_node_ghost_dbl(ref_node, hessian, 6), "update ghosts");

  return REF_SUCCESS;
}